

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.c
# Opt level: O0

ZyanStatus
ZydisFormatterTokenizeOperand
          (ZydisFormatter *formatter,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operand,void *buffer,ZyanUSize length,ZyanU64 runtime_address,
          ZydisFormatterTokenConst **token,void *user_data)

{
  ZyanStatus ZVar1;
  uint uVar2;
  ZyanStatus status_047620348_5;
  ZyanStatus status_047620348_4;
  ZyanStatus status_047620348_3;
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZydisFormatterContext context;
  ZydisFormatterBuffer formatter_buffer;
  ZydisFormatterToken *first_token;
  ZyanU64 runtime_address_local;
  ZyanUSize length_local;
  void *buffer_local;
  ZydisDecodedOperand *operand_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisFormatter *formatter_local;
  
  if (((((formatter == (ZydisFormatter *)0x0) || (instruction == (ZydisDecodedInstruction *)0x0)) ||
       (operand == (ZydisDecodedOperand *)0x0)) || ((buffer == (void *)0x0 || (length < 3)))) ||
     (token == (ZydisFormatterTokenConst **)0x0)) {
    return 0x80100004;
  }
  ZydisFormatterBufferInitTokenized
            ((ZydisFormatterBuffer *)&context.user_data,
             (ZydisFormatterToken **)&formatter_buffer.string.vector.data,buffer,length);
  context.instruction = (ZydisDecodedInstruction *)0x0;
  context.runtime_address = (ZyanU64)user_data;
  _status_047620348_1 = instruction;
  context.operands = operand;
  context.operand = (ZydisDecodedOperand *)runtime_address;
  if ((formatter->func_pre_operand != (ZydisFormatterFunc)0x0) &&
     (ZVar1 = (*formatter->func_pre_operand)
                        (formatter,(ZydisFormatterBuffer *)&context.user_data,
                         (ZydisFormatterContext *)&status_047620348_1), (ZVar1 & 0x80000000) != 0))
  {
    return ZVar1;
  }
  switch((context.operands)->type) {
  case ZYDIS_OPERAND_TYPE_REGISTER:
    formatter_local._4_4_ =
         (*formatter->func_format_operand_reg)
                   (formatter,(ZydisFormatterBuffer *)&context.user_data,
                    (ZydisFormatterContext *)&status_047620348_1);
    break;
  case ZYDIS_OPERAND_TYPE_MEMORY:
    formatter_local._4_4_ =
         (*formatter->func_format_operand_mem)
                   (formatter,(ZydisFormatterBuffer *)&context.user_data,
                    (ZydisFormatterContext *)&status_047620348_1);
    break;
  case ZYDIS_OPERAND_TYPE_POINTER:
    uVar2 = (*formatter->func_format_operand_ptr)
                      (formatter,(ZydisFormatterBuffer *)&context.user_data,
                       (ZydisFormatterContext *)&status_047620348_1);
    goto joined_r0x0011d4f9;
  case ZYDIS_OPERAND_TYPE_IMMEDIATE:
    uVar2 = (*formatter->func_format_operand_imm)
                      (formatter,(ZydisFormatterBuffer *)&context.user_data,
                       (ZydisFormatterContext *)&status_047620348_1);
joined_r0x0011d4f9:
    if ((uVar2 & 0x80000000) != 0) {
      return uVar2;
    }
    goto LAB_0011d562;
  default:
    return 0x80100004;
  }
  if ((formatter_local._4_4_ & 0x80000000) == 0) {
LAB_0011d562:
    if ((formatter->func_post_operand == (ZydisFormatterFunc)0x0) ||
       (formatter_local._4_4_ =
             (*formatter->func_post_operand)
                       (formatter,(ZydisFormatterBuffer *)&context.user_data,
                        (ZydisFormatterContext *)&status_047620348_1),
       (formatter_local._4_4_ & 0x80000000) == 0)) {
      if (*(char *)((long)formatter_buffer.string.vector.data + 1) == '\0') {
        *token = (ZydisFormatterTokenConst *)formatter_buffer.string.vector.data;
        formatter_local._4_4_ = 0x100000;
      }
      else {
        *token = (ZydisFormatterTokenConst *)
                 ((long)formatter_buffer.string.vector.data +
                 (long)(int)(uint)*(byte *)((long)formatter_buffer.string.vector.data + 1) + 2);
        formatter_local._4_4_ = 0x100000;
      }
    }
  }
  return formatter_local._4_4_;
}

Assistant:

ZyanStatus ZydisFormatterTokenizeOperand(const ZydisFormatter* formatter,
    const ZydisDecodedInstruction* instruction, const ZydisDecodedOperand* operand,
    void* buffer, ZyanUSize length, ZyanU64 runtime_address, ZydisFormatterTokenConst** token,
    void* user_data)
{
    if (!formatter || !instruction || !operand || !buffer ||
        (length <= sizeof(ZydisFormatterToken)) || !token)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZydisFormatterToken* first_token;
    ZydisFormatterBuffer formatter_buffer;
    ZydisFormatterBufferInitTokenized(&formatter_buffer, &first_token, buffer, length);

    ZydisFormatterContext context;
    context.instruction     = instruction;
    context.operands        = ZYAN_NULL;
    context.runtime_address = runtime_address;
    context.operand         = operand;
    context.user_data       = user_data;

    // We ignore `ZYDIS_STATUS_SKIP_TOKEN` for all operand-functions as it does not make any sense
    // to skip the only operand printed by this function

    if (formatter->func_pre_operand)
    {
        ZYAN_CHECK(formatter->func_pre_operand(formatter, &formatter_buffer, &context));
    }

    switch (context.operand->type)
    {
    case ZYDIS_OPERAND_TYPE_REGISTER:
        ZYAN_CHECK(formatter->func_format_operand_reg(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_MEMORY:
        ZYAN_CHECK(formatter->func_format_operand_mem(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_IMMEDIATE:
        ZYAN_CHECK(formatter->func_format_operand_imm(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_POINTER:
        ZYAN_CHECK(formatter->func_format_operand_ptr(formatter, &formatter_buffer, &context));
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (formatter->func_post_operand)
    {
        ZYAN_CHECK(formatter->func_post_operand(formatter, &formatter_buffer, &context));
    }

    if (first_token->next)
    {
        *token = (ZydisFormatterTokenConst*)((ZyanU8*)first_token + sizeof(ZydisFormatterToken) +
            first_token->next);
        return ZYAN_STATUS_SUCCESS;
    }

    *token = first_token;
    return ZYAN_STATUS_SUCCESS;
}